

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprop.c
# Opt level: O0

void trn_rprop(mdl_t *mdl)

{
  char *pcVar1;
  long lVar2;
  void **ppvVar3;
  double dVar4;
  double dVar5;
  uint64_t uVar6;
  uint64_t *__ptr;
  _Bool _Var7;
  int iVar8;
  void **ppvVar9;
  undefined8 uStackY_120;
  void *pvStackY_118;
  size_t in_stack_fffffffffffffef0;
  bool local_101;
  void **local_100 [2];
  double vgp_1;
  double vstp_1;
  double vxp_1;
  uint64_t f_2;
  FILE *file_1;
  double fx;
  grd_t *pgStack_c0;
  uint32_t k;
  grd_t *grd;
  ulong uStack_b0;
  uint32_t w;
  unsigned_long __vla_expr0;
  uint64_t *local_a0;
  rprop_t *st;
  double vgp;
  double vstp;
  double vxp;
  uint64_t f_1;
  uint64_t i;
  uint64_t nftr;
  FILE *pFStack_60;
  int type;
  FILE *file;
  char *err;
  uint64_t f;
  double *gp;
  double *g;
  double *stp;
  double *xp;
  int cut;
  uint32_t uStack_1c;
  _Bool wbt;
  uint32_t W;
  uint32_t K;
  uint64_t F;
  mdl_t *mdl_local;
  
  _W = (char *)mdl->nftr;
  uStack_1c = mdl->opt->maxiter;
  cut = mdl->opt->nthread;
  uStackY_120 = 0x112d4c;
  F = (uint64_t)mdl;
  iVar8 = strcmp(mdl->opt->algo,"rprop-");
  xp._7_1_ = iVar8 != 0;
  xp._0_4_ = (uint)(*(byte *)(*(long *)F + 0xd0) & 1);
  stp = (double *)0x0;
  uStackY_120 = 0x112d7d;
  g = xvm_new(in_stack_fffffffffffffef0);
  uStackY_120 = 0x112d8a;
  gp = xvm_new(in_stack_fffffffffffffef0);
  uStackY_120 = 0x112d97;
  f = (uint64_t)xvm_new(in_stack_fffffffffffffef0);
  if (((xp._7_1_ & 1) != 0) && ((uint)xp == 0)) {
    uStackY_120 = 0x112db0;
    stp = xvm_new(in_stack_fffffffffffffef0);
  }
  for (err = (char *)0x0; err < _W; err = err + 1) {
    if (((xp._7_1_ & 1) != 0) && ((uint)xp == 0)) {
      stp[(long)err] = 0.0;
    }
    *(undefined8 *)(f + (long)err * 8) = 0;
    g[(long)err] = 0.1;
  }
  if (*(long *)(*(long *)F + 0x48) != 0) {
    file = (FILE *)anon_var_dwarf_3fbf;
    uStackY_120 = 0x112e49;
    pFStack_60 = fopen(*(char **)(*(long *)F + 0x48),"r");
    if (pFStack_60 == (FILE *)0x0) {
      uStackY_120 = 0x112e62;
      fatal("failed to open input state file");
    }
    uStackY_120 = 0x112e7c;
    iVar8 = __isoc99_fscanf(pFStack_60,"#state#%d#%lu\n",(long)&nftr + 4,&i);
    if (iVar8 != 2) {
      uStackY_120 = 0x112e8c;
      fatal((char *)file);
    }
    if (nftr._4_4_ != 3) {
      uStackY_120 = 0x112ea0;
      fatal("state is not for rprop model");
    }
    for (f_1 = 0; f_1 < i; f_1 = f_1 + 1) {
      uStackY_120 = 0x112ede;
      iVar8 = __isoc99_fscanf(pFStack_60,"%lu %la %la %la\n",&vxp,&vstp,&vgp,&st);
      if (iVar8 != 4) {
        uStackY_120 = 0x112eee;
        fatal((char *)file);
      }
      if (((xp._7_1_ & 1) != 0) && ((uint)xp == 0)) {
        stp[(long)vxp] = vstp;
      }
      *(rprop_t **)(f + (long)vxp * 8) = st;
      g[(long)vxp] = vgp;
    }
    uStackY_120 = 0x112f50;
    fclose(pFStack_60);
  }
  uStackY_120 = 0x112f5a;
  local_a0 = (uint64_t *)xmalloc(in_stack_fffffffffffffef0);
  *local_a0 = F;
  local_a0[1] = (uint64_t)stp;
  local_a0[2] = (uint64_t)g;
  local_a0[3] = (uint64_t)gp;
  local_a0[4] = f;
  __vla_expr0 = (unsigned_long)&pvStackY_118;
  lVar2 = -((ulong)(uint)cut * 8 + 0xf & 0xfffffffffffffff0);
  ppvVar9 = (void **)((long)&pvStackY_118 + lVar2);
  local_100[0] = ppvVar9;
  uStack_b0 = (ulong)(uint)cut;
  for (grd._4_4_ = 0; grd._4_4_ < (uint)cut; grd._4_4_ = grd._4_4_ + 1) {
    ppvVar9[grd._4_4_] = local_a0;
  }
  *(undefined8 *)((long)&uStackY_120 + lVar2) = 0x113026;
  pgStack_c0 = grd_new(*(mdl_t **)((long)local_100 + lVar2),
                       *(double **)(&stack0xfffffffffffffef8 + lVar2));
  fx._4_4_ = 0;
  while( true ) {
    local_101 = false;
    if ((uit_stop & 1U) == 0) {
      local_101 = fx._4_4_ < uStack_1c;
    }
    if (local_101 == false) break;
    *(undefined8 *)((long)&uStackY_120 + lVar2) = 0x113075;
    file_1 = (FILE *)grd_gradient(*(grd_t **)((long)&__vla_expr0 + lVar2));
    iVar8 = cut;
    ppvVar3 = local_100[0];
    if ((uit_stop & 1U) != 0) break;
    *(undefined8 *)((long)&uStackY_120 + lVar2) = 0x1130a7;
    mth_spawn(trn_rpropsub,iVar8,ppvVar3,0,0);
    *(undefined8 *)((long)&uStackY_120 + lVar2) = 0x1130c1;
    _Var7 = uit_progress(*(mdl_t **)((long)&__vla_expr0 + lVar2),*(uint32_t *)((long)&w + lVar2),
                         *(double *)((long)&grd + lVar2));
    if (!_Var7) break;
    fx._4_4_ = fx._4_4_ + 1;
  }
  if (*(long *)(*(long *)F + 0x50) != 0) {
    pcVar1 = *(char **)(*(long *)F + 0x50);
    *(undefined8 *)((long)&uStackY_120 + lVar2) = 0x11310c;
    f_2 = (uint64_t)fopen(pcVar1,"w");
    if ((FILE *)f_2 == (FILE *)0x0) {
      *(undefined8 *)((long)&uStackY_120 + lVar2) = 0x11312b;
      fatal("failed to open output state file");
    }
    pcVar1 = _W;
    uVar6 = f_2;
    *(undefined8 *)((long)&uStackY_120 + lVar2) = 0x113144;
    fprintf((FILE *)uVar6,"#state#3#%lu\n",pcVar1);
    for (vxp_1 = 0.0; uVar6 = f_2, dVar4 = vxp_1, (ulong)vxp_1 < _W;
        vxp_1 = (double)((long)vxp_1 + 1)) {
      if (stp == (double *)0x0) {
        vstp_1 = 0.0;
      }
      else {
        vstp_1 = stp[(long)vxp_1];
      }
      vgp_1 = g[(long)vxp_1];
      local_100[1] = *(void ***)(f + (long)vxp_1 * 8);
      *(undefined8 *)((long)&uStackY_120 + lVar2) = 0x1131ea;
      fprintf((FILE *)uVar6,"%lu ",dVar4);
      uVar6 = f_2;
      dVar5 = vstp_1;
      dVar4 = vgp_1;
      ppvVar3 = local_100[1];
      *(undefined8 *)((long)&uStackY_120 + lVar2) = 0x113217;
      fprintf((FILE *)uVar6,"%la %la %la\n",dVar5,dVar4,ppvVar3);
    }
    *(undefined8 *)((long)&uStackY_120 + lVar2) = 0x11323a;
    fclose((FILE *)uVar6);
  }
  if (((xp._7_1_ & 1) != 0) && ((uint)xp == 0)) {
    *(undefined8 *)((long)&uStackY_120 + lVar2) = 0x11324f;
    xvm_free((double *)*ppvVar9);
  }
  *(undefined8 *)((long)&uStackY_120 + lVar2) = 0x113258;
  xvm_free((double *)*ppvVar9);
  *(undefined8 *)((long)&uStackY_120 + lVar2) = 0x113261;
  xvm_free((double *)*ppvVar9);
  *(undefined8 *)((long)&uStackY_120 + lVar2) = 0x11326a;
  xvm_free((double *)*ppvVar9);
  *(undefined8 *)((long)&uStackY_120 + lVar2) = 0x113276;
  grd_free(*(grd_t **)(&stack0xfffffffffffffef0 + lVar2));
  __ptr = local_a0;
  *(undefined8 *)((long)&uStackY_120 + lVar2) = 0x113282;
  free(__ptr);
  return;
}

Assistant:

void trn_rprop(mdl_t *mdl) {
	const uint64_t F   = mdl->nftr;
	const uint32_t K   = mdl->opt->maxiter;
	const uint32_t W   = mdl->opt->nthread;
	const bool     wbt = strcmp(mdl->opt->algo, "rprop-");
	const int      cut = mdl->opt->rprop.cutoff;
	// Allocate state memory and initialize it
	double *xp  = NULL,       *stp = xvm_new(F);
	double *g   = xvm_new(F), *gp  = xvm_new(F);
	if (wbt && !cut)
		xp = xvm_new(F);
	for (uint64_t f = 0; f < F; f++) {
		if (wbt && !cut)
			xp[f]  = 0.0;
		gp[f]  = 0.0;
		stp[f] = 0.1;
	}
	// Restore a saved state if given by the user
	if (mdl->opt->rstate != NULL) {
		const char *err = "invalid state file";
		FILE *file = fopen(mdl->opt->rstate, "r");
		if (file == NULL)
			fatal("failed to open input state file");
		int type;
		uint64_t nftr;
		if (fscanf(file, "#state#%d#%"SCNu64"\n", &type, &nftr) != 2)
			fatal(err);
		if (type != 3)
			fatal("state is not for rprop model");
		for (uint64_t i = 0; i < nftr; i++) {
			uint64_t f;
			double vxp, vstp, vgp;
			if (fscanf(file, "%"PRIu64" %la %la %la\n", &f, &vxp,
					&vstp, &vgp) != 4)
				fatal(err);
			if (wbt && !cut) xp[f] = vxp;
			gp[f] = vgp;
			stp[f] = vstp;
		}
		fclose(file);
	}
	// Prepare the rprop state used to send information to the rprop worker
	// about updating weight using the gradient.
	rprop_t *st = xmalloc(sizeof(rprop_t));
	st->mdl = mdl;
	st->xp  = xp;  st->stp = stp;
	st->g   = g;   st->gp  = gp;
	rprop_t *rprop[W];
	for (uint32_t w = 0; w < W; w++)
		rprop[w] = st;
	// Prepare the gradient state for the distributed gradient computation.
	grd_t *grd = grd_new(mdl, g);
	// And iterate the gradient computation / weight update process until
	// convergence or stop request
	for (uint32_t k = 0; !uit_stop && k < K; k++) {
		double fx = grd_gradient(grd);
		if (uit_stop)
			break;
		mth_spawn((func_t *)trn_rpropsub, W, (void **)rprop, 0, 0);
		if (uit_progress(mdl, k + 1, fx) == false)
			break;
	}
	// Save state if user requested it
	if (mdl->opt->sstate != NULL) {
		FILE *file = fopen(mdl->opt->sstate, "w");
		if (file == NULL)
			fatal("failed to open output state file");
		fprintf(file, "#state#3#%"PRIu64"\n", F);
		for (uint64_t f = 0; f < F; f++) {
			double vxp = xp != NULL ? xp[f] : 0.0;
			double vstp = stp[f], vgp = gp[f];
			fprintf(file, "%"PRIu64" ", f);
			fprintf(file, "%la %la %la\n", vxp, vstp, vgp);
		}
		fclose(file);
	}
	// Free all allocated memory
	if (wbt && !cut)
		xvm_free(xp);
	xvm_free(g);
	xvm_free(gp);
	xvm_free(stp);
	grd_free(grd);
	free(st);
}